

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

size_t GrowNallocxTestSize(size_t sz)

{
  ulong uVar1;
  size_t divided;
  size_t sz_local;
  undefined8 local_8;
  
  if (sz < 0x400) {
    local_8 = sz + 7;
  }
  else {
    uVar1 = sz >> 8 | sz >> 7;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    local_8 = sz + (uVar1 >> 0x10 | uVar1) + 1;
  }
  return local_8;
}

Assistant:

static size_t GrowNallocxTestSize(size_t sz) {
  if (sz < 1024) {
    return sz + 7;
  }

  size_t divided = sz >> 7;
  divided |= (divided >> 1);
  divided |= (divided >> 2);
  divided |= (divided >> 4);
  divided |= (divided >> 8);
  divided |= (divided >> 16);
  divided += 1;
  return sz + divided;
}